

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_2_i64(TCGContext_conflict9 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
                 _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_conflict9 *fni)

{
  TCGv_i64 arg;
  uint local_34;
  uint32_t i;
  TCGv_i64 t0;
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_conflict9 *fni_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_i64(tcg_ctx);
  for (local_34 = 0; local_34 < oprsz; local_34 = local_34 + 8) {
    tcg_gen_ld_i64_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(aofs + local_34));
    (*fni)(tcg_ctx,arg,arg);
    tcg_gen_st_i64_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(dofs + local_34));
  }
  tcg_temp_free_i64(tcg_ctx,arg);
  return;
}

Assistant:

static void expand_2_i64(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                         void (*fni)(TCGContext *, TCGv_i64, TCGv_i64))
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    uint32_t i;

    for (i = 0; i < oprsz; i += 8) {
        tcg_gen_ld_i64(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        fni(tcg_ctx, t0, t0);
        tcg_gen_st_i64(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_i64(tcg_ctx, t0);
}